

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::checkCompletion(QPDFArgParser *this)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  string local_158 [32];
  string local_138 [39];
  char local_111;
  ulong uStack_110;
  char ch_1;
  size_t p1;
  string local_e8 [38];
  char local_c2;
  char local_c1;
  string local_c0 [6];
  char ch;
  char sep;
  ulong local_a0;
  size_t p;
  string local_90;
  undefined1 local_6d;
  bool got_point;
  allocator<char> local_59;
  string local_58;
  byte local_31;
  undefined1 local_30 [7];
  bool got_line;
  string bash_point_env;
  QPDFArgParser *this_local;
  
  bash_point_env.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"COMP_LINE",&local_59);
  peVar4 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar2 = QUtil::get_env(&local_58,&peVar4->bash_line);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_31 = bVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"COMP_POINT",(allocator<char> *)((long)&p + 7));
  bVar2 = QUtil::get_env(&local_90,(string *)local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&p + 7));
  local_6d = bVar2;
  if (((local_31 & 1) != 0) || (bVar2)) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    uVar3 = QUtil::string_to_uint(pcVar5);
    local_a0 = (ulong)uVar3;
    std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    uVar6 = std::__cxx11::string::length();
    if (uVar3 < uVar6) {
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::substr((ulong)local_c0,(ulong)&peVar4->bash_line);
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&peVar4->bash_line,local_c0);
      std::__cxx11::string::~string(local_c0);
    }
    uVar6 = local_a0;
    std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    uVar7 = std::__cxx11::string::length();
    if (uVar7 < uVar6) {
      std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this);
      local_a0 = std::__cxx11::string::length();
    }
    local_c1 = '\0';
    while (cVar1 = local_c1, local_a0 != 0) {
      local_a0 = local_a0 - 1;
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pcVar5 = (char *)std::__cxx11::string::at((ulong)&peVar4->bash_line);
      local_c2 = *pcVar5;
      cVar1 = local_c2;
      if (((local_c2 == ' ') || (cVar1 = local_c2, local_c2 == '=')) ||
         (cVar1 = local_c2, local_c2 == ':')) break;
    }
    local_c1 = cVar1;
    uVar6 = local_a0 + 1;
    std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    uVar7 = std::__cxx11::string::length();
    if (uVar6 <= uVar7) {
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::substr((ulong)local_e8,(ulong)&peVar4->bash_line);
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&peVar4->bash_cur,local_e8);
      std::__cxx11::string::~string(local_e8);
    }
    if ((local_c1 == ':') || (local_c1 == '=')) {
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::substr((ulong)&p1,(ulong)&peVar4->bash_line);
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&peVar4->bash_prev,(string *)&p1);
      std::__cxx11::string::~string((string *)&p1);
    }
    else {
      uStack_110 = local_a0;
      do {
        if (uStack_110 == 0) goto LAB_001c3dc8;
        uStack_110 = uStack_110 - 1;
        peVar4 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pcVar5 = (char *)std::__cxx11::string::at((ulong)&peVar4->bash_line);
        local_111 = *pcVar5;
      } while (((local_111 != ' ') && (local_111 != ':')) && (local_111 != '='));
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::substr((ulong)local_138,(ulong)&peVar4->bash_line);
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&peVar4->bash_prev,local_138);
      std::__cxx11::string::~string(local_138);
    }
LAB_001c3dc8:
    std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::substr((ulong)local_158,(ulong)&peVar4->bash_line);
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&peVar4->bash_prev,local_158);
      std::__cxx11::string::~string(local_158);
    }
    peVar4 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if (peVar4->argc == 1) {
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar4->zsh_completion = true;
    }
    handleBashArguments(this);
    peVar4 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4->bash_completion = true;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void
QPDFArgParser::checkCompletion()
{
    // See if we're being invoked from bash completion.
    std::string bash_point_env;
    // On Windows with mingw, there have been times when there appears to be no way to distinguish
    // between an empty environment variable and an unset variable. There are also conditions under
    // which bash doesn't set COMP_LINE. Therefore, enter this logic if either COMP_LINE or
    // COMP_POINT are set. They will both be set together under ordinary circumstances.
    bool got_line = QUtil::get_env("COMP_LINE", &m->bash_line);
    bool got_point = QUtil::get_env("COMP_POINT", &bash_point_env);
    if (got_line || got_point) {
        size_t p = QUtil::string_to_uint(bash_point_env.c_str());
        if (p < m->bash_line.length()) {
            // Truncate the line. We ignore everything at or after the
            // cursor for completion purposes.
            m->bash_line = m->bash_line.substr(0, p);
        }
        if (p > m->bash_line.length()) {
            p = m->bash_line.length();
        }
        // Set bash_cur and bash_prev based on bash_line rather than relying on argv. This enables
        // us to use bashcompinit to get completion in zsh too since bashcompinit sets COMP_LINE and
        // COMP_POINT but doesn't invoke the command with options like bash does.

        // p is equal to length of the string. Walk backwards looking for the first separator.
        // bash_cur is everything after the last separator, possibly empty.
        char sep(0);
        while (p > 0) {
            --p;
            char ch = m->bash_line.at(p);
            if ((ch == ' ') || (ch == '=') || (ch == ':')) {
                sep = ch;
                break;
            }
        }
        if (1 + p <= m->bash_line.length()) {
            m->bash_cur = m->bash_line.substr(1 + p, std::string::npos);
        }
        if ((sep == ':') || (sep == '=')) {
            // Bash sets prev to the non-space separator if any. Actually, if there are multiple
            // separators in a row, they are all included in prev, but that detail is not important
            // to us and not worth coding.
            m->bash_prev = m->bash_line.substr(p, 1);
        } else {
            // Go back to the last separator and set prev based on
            // that.
            size_t p1 = p;
            while (p1 > 0) {
                --p1;
                char ch = m->bash_line.at(p1);
                if ((ch == ' ') || (ch == ':') || (ch == '=')) {
                    m->bash_prev = m->bash_line.substr(p1 + 1, p - p1 - 1);
                    break;
                }
            }
        }
        if (m->bash_prev.empty()) {
            m->bash_prev = m->bash_line.substr(0, p);
        }
        if (m->argc == 1) {
            // This is probably zsh using bashcompinit. There are a few differences in the expected
            // output.
            m->zsh_completion = true;
        }
        handleBashArguments();
        m->bash_completion = true;
    }
}